

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.hh
# Opt level: O1

void __thiscall ContextField::ContextField(ContextField *this,bool s,int4 sbit,int4 ebit)

{
  int iVar1;
  uint uVar2;
  
  *(undefined4 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__PatternExpression_003cd590;
  this->signbit = s;
  this->startbit = sbit;
  this->endbit = ebit;
  iVar1 = sbit + 7;
  if (-1 < sbit) {
    iVar1 = sbit;
  }
  uVar2 = ebit + 7;
  if (-1 < ebit) {
    uVar2 = ebit;
  }
  this->startbyte = iVar1 >> 3;
  this->endbyte = (int)uVar2 >> 3;
  this->shift = ((uVar2 & 0xfffffff8) - ebit) + 7;
  return;
}

Assistant:

PatternExpression(void) { refcount = 0; }